

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::openindexfiles(summarycalc *this)

{
  bool bVar1;
  reference ppVar2;
  char *__filename;
  FILE *pFVar3;
  FILE *f;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  x;
  iterator __end1;
  iterator __begin1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  summarycalc *this_local;
  
  __end1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->indexFiles);
  x._32_8_ = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->indexFiles);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&x.field_0x20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&f,ppVar2);
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen(__filename,"w");
    this->idxout[(int)f] = (FILE *)pFVar3;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&f);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void summarycalc::openindexfiles()
{
	for (auto x : indexFiles) {
		FILE *f = fopen(x.second.c_str(), "w");
		idxout[x.first] = f;
	}
}